

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

void TestEnergyConservation
               (function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
                *createBSDF,char *description)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  undefined1 auVar15 [16];
  bool bVar16;
  int i;
  uint uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  BSDF *this_00;
  long lVar19;
  size_t sVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  bool *__args_2;
  int iVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar32 [16];
  float fVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  float fVar37;
  undefined4 uVar38;
  float fVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM6 [16];
  Vector3f woRender;
  float in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  AssertHelper local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  bool reverseOrientation;
  undefined1 local_239;
  AssertionResult gtest_ar_;
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  AssertionResult gtest_ar;
  shared_ptr<pbrt::Disk> disk;
  Ray local_160;
  optional<pbrt::ShapeIntersection> si;
  
  pbrt::RotateX((Transform *)&si,-90.0);
  p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x90);
  p_Var18->_M_use_count = 1;
  p_Var18->_M_weak_count = 1;
  p_Var18->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_02ee0ad0;
  p_Var18[1]._vptr__Sp_counted_base = (_func_int **)si.optionalValue.__align;
  p_Var18[1]._M_use_count = si.optionalValue._8_4_;
  p_Var18[1]._M_weak_count = si.optionalValue._12_4_;
  p_Var18[2]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._16_8_;
  p_Var18[2]._M_use_count = si.optionalValue._24_4_;
  p_Var18[2]._M_weak_count = si.optionalValue._28_4_;
  p_Var18[3]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._32_8_;
  p_Var18[3]._M_use_count = si.optionalValue._40_4_;
  p_Var18[3]._M_weak_count = si.optionalValue._44_4_;
  p_Var18[4]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._48_8_;
  p_Var18[4]._M_use_count = si.optionalValue._56_4_;
  p_Var18[4]._M_weak_count = si.optionalValue._60_4_;
  p_Var18[5]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._64_8_;
  p_Var18[5]._M_use_count = si.optionalValue._72_4_;
  p_Var18[5]._M_weak_count = si.optionalValue._76_4_;
  p_Var18[6]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._80_8_;
  p_Var18[6]._M_use_count = si.optionalValue._88_4_;
  p_Var18[6]._M_weak_count = si.optionalValue._92_4_;
  p_Var18[7]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._96_8_;
  p_Var18[7]._M_use_count = si.optionalValue._104_4_;
  p_Var18[7]._M_weak_count = si.optionalValue._108_4_;
  p_Var18[8]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._112_8_;
  p_Var18[8]._M_use_count = si.optionalValue._120_4_;
  p_Var18[8]._M_weak_count = si.optionalValue._124_4_;
  si.optionalValue.__align = (anon_struct_8_0_00000001_for___align)p_Var18[5]._vptr__Sp_counted_base
  ;
  si.optionalValue._8_4_ = p_Var18[5]._M_use_count;
  si.optionalValue._12_4_ = p_Var18[5]._M_weak_count;
  si.optionalValue._16_8_ = p_Var18[6]._vptr__Sp_counted_base;
  si.optionalValue._24_4_ = p_Var18[6]._M_use_count;
  si.optionalValue._28_4_ = p_Var18[6]._M_weak_count;
  si.optionalValue._32_8_ = p_Var18[7]._vptr__Sp_counted_base;
  si.optionalValue._40_4_ = p_Var18[7]._M_use_count;
  si.optionalValue._44_4_ = p_Var18[7]._M_weak_count;
  si.optionalValue._48_8_ = p_Var18[8]._vptr__Sp_counted_base;
  si.optionalValue._56_4_ = p_Var18[8]._M_use_count;
  si.optionalValue._60_4_ = p_Var18[8]._M_weak_count;
  si.optionalValue._64_8_ = p_Var18[1]._vptr__Sp_counted_base;
  si.optionalValue._72_4_ = p_Var18[1]._M_use_count;
  si.optionalValue._76_4_ = p_Var18[1]._M_weak_count;
  si.optionalValue._80_8_ = p_Var18[2]._vptr__Sp_counted_base;
  si.optionalValue._88_4_ = p_Var18[2]._M_use_count;
  si.optionalValue._92_4_ = p_Var18[2]._M_weak_count;
  si.optionalValue._96_8_ = p_Var18[3]._vptr__Sp_counted_base;
  si.optionalValue._104_4_ = p_Var18[3]._M_use_count;
  si.optionalValue._108_4_ = p_Var18[3]._M_weak_count;
  si.optionalValue._112_8_ = p_Var18[4]._vptr__Sp_counted_base;
  si.optionalValue._120_4_ = p_Var18[4]._M_use_count;
  si.optionalValue._124_4_ = p_Var18[4]._M_weak_count;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x90);
  local_228._0_8_ = this + 1;
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  __args_2 = &reverseOrientation;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_02ee0ad0;
  auVar36._8_8_ = si.optionalValue._72_8_;
  auVar36._0_8_ = si.optionalValue._64_8_;
  auVar36._16_8_ = si.optionalValue._80_8_;
  auVar36._24_8_ = si.optionalValue._88_8_;
  auVar36._32_8_ = si.optionalValue._96_8_;
  auVar36._40_8_ = si.optionalValue._104_8_;
  auVar36._48_8_ = si.optionalValue._112_8_;
  auVar36._56_8_ = si.optionalValue._120_8_;
  reverseOrientation = false;
  local_250.data_._0_4_ = 0;
  gtest_ar_._0_8_ = 0x3ff0000000000000;
  gtest_ar._0_8_ = &DAT_4076800000000000;
  this[1]._vptr__Sp_counted_base = (_func_int **)si.optionalValue.__align;
  this[1]._M_use_count = si.optionalValue._8_4_;
  this[1]._M_weak_count = si.optionalValue._12_4_;
  this[2]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._16_8_;
  this[2]._M_use_count = si.optionalValue._24_4_;
  this[2]._M_weak_count = si.optionalValue._28_4_;
  this[3]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._32_8_;
  this[3]._M_use_count = si.optionalValue._40_4_;
  this[3]._M_weak_count = si.optionalValue._44_4_;
  this[4]._vptr__Sp_counted_base = (_func_int **)si.optionalValue._48_8_;
  this[4]._M_use_count = si.optionalValue._56_4_;
  this[4]._M_weak_count = si.optionalValue._60_4_;
  *(undefined1 (*) [64])(this + 5) = auVar36;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_248 = p_Var18;
  si.optionalValue.__align = (anon_struct_8_0_00000001_for___align)(p_Var18 + 1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Disk,std::allocator<pbrt::Disk>,pbrt::Transform_const*,pbrt::Transform_const*,bool&,double,double,int,double>
            (&disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Disk **)&disk,(allocator<pbrt::Disk> *)&local_239,(Transform **)&si,
             (Transform **)local_228,__args_2,(double *)&local_160,(double *)&gtest_ar_,
             (int *)&local_250,(double *)&gtest_ar);
  local_160.o.super_Tuple3<pbrt::Point3,_float>.x = 0.1;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.y = 1.0;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_160.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_160.d.super_Tuple3<pbrt::Vector3,_float>.y = -1.0;
  local_160.d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_160.time = 0.0;
  local_160.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  pbrt::Disk::Intersect
            (&si,disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_160,
             INFINITY);
  gtest_ar_.success_ = si.set;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (si.set == false) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_228,(internal *)&gtest_ar_,(AssertionResult *)"si.has_value()",
               "false","true",__args_2);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
               ,0x1ee,(char *)local_228._0_8_);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((Transform *)local_228._0_8_ != (Transform *)local_218) {
      operator_delete((void *)local_228._0_8_,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
    }
    if (((gtest_ar._0_8_ != 0) && (bVar16 = testing::internal::IsTrue(true), bVar16)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (si.set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
    }
    local_228._0_8_ = pstd::pmr::new_delete_resource();
    if ((createBSDF->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    this_00 = (*createBSDF->_M_invoker)
                        ((_Any_data *)createBSDF,(SurfaceInteraction *)&si,
                         (polymorphic_allocator<std::byte> *)local_228);
    uVar22 = 0x853c49e6748fea9b;
    iVar21 = 0;
    do {
      uVar23 = uVar22 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar22;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar23;
      auVar32 = vpunpcklqdq_avx(auVar39,auVar29);
      auVar28 = vpsrlvq_avx2(auVar32,_DAT_0054e5c0);
      auVar29 = vpsrlvq_avx2(auVar32,_DAT_0054e5b0);
      auVar32 = vpsrlq_avx(auVar32,0x3b);
      auVar32 = vpshufd_avx(auVar32,0xe8);
      auVar28 = vpshufd_avx(auVar29 ^ auVar28,0xe8);
      auVar32 = vprorvd_avx512vl(auVar28,auVar32);
      auVar28 = vcvtudq2ps_avx512vl(auVar32);
      auVar32._8_4_ = 0x2f800000;
      auVar32._0_8_ = 0x2f8000002f800000;
      auVar32._12_4_ = 0x2f800000;
      auVar29 = vmulps_avx512vl(auVar28,auVar32);
      auVar28._8_4_ = 0x3f7fffff;
      auVar28._0_8_ = 0x3f7fffff3f7fffff;
      auVar28._12_4_ = 0x3f7fffff;
      uVar22 = vcmpps_avx512vl(auVar29,auVar28,1);
      auVar32 = vmovshdup_avx(auVar29);
      bVar14 = (byte)(uVar22 >> 1);
      fVar26 = (float)((uint)(bVar14 & 1) * auVar32._0_4_ + (uint)!(bool)(bVar14 & 1) * 0x3f7fffff);
      auVar32 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar26 * fVar26)),ZEXT416(0));
      auVar32 = vsqrtss_avx(auVar32,auVar32);
      fVar27 = (float)((uint)((byte)uVar22 & 1) * (int)(auVar29._0_4_ * 6.2831855) +
                      (uint)!(bool)((byte)uVar22 & 1) * 0x40c90fda);
      fVar30 = cosf(fVar27);
      fVar30 = fVar30 * auVar32._0_4_;
      fVar31 = sinf(fVar27);
      fVar31 = fVar31 * auVar32._0_4_;
      iVar25 = 0x4000;
      uVar22 = uVar23 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar4 = (this_00->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar7 = (this_00->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar5 = (this_00->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar8 = (this_00->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar27 = (this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar6 = (this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar9 = (this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar2 = (this_00->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar37 = fVar30 * (float)uVar4 + fVar31 * (float)uVar6 + fVar26 * (float)uVar5;
      fVar41 = fVar30 * (float)uVar7 + fVar31 * (float)uVar9 + fVar26 * (float)uVar8;
      fVar3 = (this_00->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z;
      gtest_ar_._0_12_ = ZEXT812(0);
      gtest_ar_.message_.ptr_._4_4_ = 0.0;
      do {
        uVar17 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
        bVar14 = (byte)(uVar22 >> 0x3b);
        auVar32 = vcvtusi2ss_avx512f(in_XMM6,uVar17 >> bVar14 | uVar17 << 0x20 - bVar14);
        uVar22 = uVar22 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        auVar32 = vminss_avx(ZEXT416((uint)(auVar32._0_4_ * 2.3283064e-10)),
                             SUB6416(ZEXT464(0x3f7fffff),0));
        uVar23 = uVar22 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar22;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar23;
        auVar28 = vpunpcklqdq_avx(auVar33,auVar40);
        auVar29 = vpsrlvq_avx2(auVar28,_DAT_0054e5b0);
        auVar39 = vpsrlvq_avx2(auVar28,_DAT_0054e5c0);
        auVar28 = vpsrlq_avx(auVar28,0x3b);
        auVar28 = vpshufd_avx(auVar28,0xe8);
        auVar29 = vpshufd_avx(auVar29 ^ auVar39,0xe8);
        auVar28 = vprorvd_avx512vl(auVar29,auVar28);
        auVar28 = vcvtudq2ps_avx512vl(auVar28);
        auVar10._8_4_ = 0x2f800000;
        auVar10._0_8_ = 0x2f8000002f800000;
        auVar10._12_4_ = 0x2f800000;
        auVar28 = vmulps_avx512vl(auVar28,auVar10);
        auVar11._8_4_ = 0x3f7fffff;
        auVar11._0_8_ = 0x3f7fffff3f7fffff;
        auVar11._12_4_ = 0x3f7fffff;
        auVar28 = vminps_avx512vl(auVar28,auVar11);
        woRender.super_Tuple3<pbrt::Vector3,_float>.y = fVar41;
        woRender.super_Tuple3<pbrt::Vector3,_float>.x = fVar37;
        woRender.super_Tuple3<pbrt::Vector3,_float>.z =
             fVar30 * fVar2 + fVar31 * fVar27 + fVar26 * fVar3;
        pbrt::BSDF::Sample_f
                  ((optional<pbrt::BSDFSample> *)local_228,this_00,woRender,auVar32._0_4_,
                   (Point2f)auVar28._0_8_,Radiance,All);
        if (local_218[0x1c] == true) {
          if (si.set == false) {
            pbrt::LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
          }
          auVar32 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._44_4_),
                                    ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                  (float)local_218._8_4_)),
                                    ZEXT416((uint)local_218._4_4_));
          auVar28 = vfmsub213ss_fma(ZEXT416((uint)local_218._8_4_),
                                    ZEXT416((uint)si.optionalValue._48_4_),
                                    ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                  (float)local_218._8_4_)));
          auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ + auVar28._0_4_)),
                                    ZEXT416((uint)si.optionalValue._40_4_),
                                    ZEXT416((uint)local_218._0_4_));
          uVar38 = auVar32._0_4_;
          auVar34._4_4_ = uVar38;
          auVar34._0_4_ = uVar38;
          auVar34._8_4_ = uVar38;
          auVar34._12_4_ = uVar38;
          auVar12._8_4_ = 0x7fffffff;
          auVar12._0_8_ = 0x7fffffff7fffffff;
          auVar12._12_4_ = 0x7fffffff;
          auVar32 = vandps_avx512vl(auVar34,auVar12);
          auVar35._0_4_ = auVar32._0_4_ * (float)local_228._0_4_;
          auVar35._4_4_ = auVar32._4_4_ * (float)local_228._4_4_;
          auVar35._8_4_ = auVar32._8_4_ * (float)local_228._8_4_;
          auVar35._12_4_ = auVar32._12_4_ * (float)local_228._12_4_;
          auVar13._4_4_ = local_218._12_4_;
          auVar13._0_4_ = local_218._12_4_;
          auVar13._8_4_ = local_218._12_4_;
          auVar13._12_4_ = local_218._12_4_;
          auVar32 = vdivps_avx512vl(auVar35,auVar13);
          gtest_ar_._4_4_ = auVar32._4_4_ + (float)gtest_ar_._4_4_;
          gtest_ar_._0_4_ = auVar32._0_4_ + (float)gtest_ar_._0_4_;
          gtest_ar_.message_.ptr_._0_4_ = auVar32._8_4_ + gtest_ar_.message_.ptr_._0_4_;
          gtest_ar_.message_.ptr_._4_4_ = auVar32._12_4_ + gtest_ar_.message_.ptr_._4_4_;
        }
        uVar22 = uVar23 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        iVar25 = iVar25 + -1;
      } while (iVar25 != 0);
      lVar19 = 1;
      gtest_ar_._0_4_ = (float)gtest_ar_._0_4_ * 6.1035156e-05;
      gtest_ar_._4_4_ = (float)gtest_ar_._4_4_ * 6.1035156e-05;
      gtest_ar_.message_.ptr_._0_4_ = gtest_ar_.message_.ptr_._0_4_ * 6.1035156e-05;
      gtest_ar_.message_.ptr_._4_4_ = gtest_ar_.message_.ptr_._4_4_ * 6.1035156e-05;
      auVar36 = ZEXT464((uint)gtest_ar_._0_4_);
      do {
        lVar1 = lVar19 * 4;
        lVar19 = lVar19 + 1;
        auVar32 = vmaxss_avx(ZEXT416(*(uint *)(&gtest_ar_.success_ + lVar1)),auVar36._0_16_);
        auVar36 = ZEXT1664(auVar32);
      } while (lVar19 != 4);
      local_250.data_._0_4_ = auVar32._0_4_;
      local_228._0_8_ = &DAT_3ff028f5c28f5c29;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"Lo.MaxComponentValue()","1.01",(float *)&local_250,
                 (double *)local_228);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_250);
        lVar19 = CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_);
        if (description == (char *)0x0) {
          sVar20 = 6;
          pcVar24 = "(null)";
        }
        else {
          sVar20 = strlen(description);
          pcVar24 = description;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(lVar19 + 0x10),pcVar24,sVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) + 0x10),
                   ": Lo = ",7);
        lVar19 = CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_);
        pbrt::SampledSpectrum::ToString_abi_cxx11_
                  ((string *)local_228,(SampledSpectrum *)&gtest_ar_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(lVar19 + 0x10),(char *)local_228._0_8_,
                   CONCAT44(local_228._12_4_,local_228._8_4_));
        if ((Transform *)local_228._0_8_ != (Transform *)local_218) {
          operator_delete((void *)local_228._0_8_,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) + 0x10),
                   ", wo = ",7);
        auVar15._4_4_ = fVar41;
        auVar15._0_4_ = fVar37;
        auVar15._8_4_ = fVar30 * 0.0 + fVar31 * 0.0 + fVar26 * 0.0;
        auVar15._12_4_ = fVar30 * 0.0 + fVar31 * 0.0 + fVar26 * 0.0;
        lVar19 = CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_);
        vmovshdup_avx(auVar15);
        pbrt::internal::ToString3<float>(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,0.0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(lVar19 + 0x10),(char *)local_228._0_8_,
                   CONCAT44(local_228._12_4_,local_228._8_4_));
        if ((Transform *)local_228._0_8_ != (Transform *)local_218) {
          operator_delete((void *)local_228._0_8_,CONCAT44(local_218._4_4_,local_218._0_4_) + 1);
        }
        pcVar24 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar24 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                   ,0x201,pcVar24);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)&local_250);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
        if (((CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) != 0) &&
            (bVar16 = testing::internal::IsTrue(true), bVar16)) &&
           ((long *)CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar21 = iVar21 + 1;
    } while (iVar21 != 10);
  }
  if (disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
  return;
}

Assistant:

static void TestEnergyConservation(
    std::function<BSDF*(const SurfaceInteraction&, Allocator)> createBSDF,
    const char* description) {
    RNG rng;

    // Create BSDF, which requires creating a Shape, casting a Ray that
    // hits the shape to get a SurfaceInteraction object.
    auto t = std::make_shared<const Transform>(RotateX(-90));
    auto tInv = std::make_shared<const Transform>(Inverse(*t));

    bool reverseOrientation = false;
    std::shared_ptr<Disk> disk =
        std::make_shared<Disk>(t.get(), tInv.get(), reverseOrientation, 0., 1., 0, 360.);
    Point3f origin(0.1, 1,
                   0);  // offset slightly so we don't hit center of disk
    Vector3f direction(0, -1, 0);
    Ray r(origin, direction);
    auto si = disk->Intersect(r);
    ASSERT_TRUE(si.has_value());
    BSDF* bsdf = createBSDF(si->intr, Allocator());

    for (int i = 0; i < 10; ++i) {
        Point2f uo{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Vector3f woL = SampleUniformHemisphere(uo);
        Vector3f wo = bsdf->LocalToRender(woL);

        const int nSamples = 16384;
        SampledSpectrum Lo(0.f);
        for (int j = 0; j < nSamples; ++j) {
            Float u = rng.Uniform<Float>();
            Point2f ui{rng.Uniform<Float>(), rng.Uniform<Float>()};
            pstd::optional<BSDFSample> bs = bsdf->Sample_f(wo, u, ui);
            if (bs)
                Lo += bs->f * AbsDot(bs->wi, si->intr.n) / bs->pdf;
        }
        Lo /= nSamples;

        EXPECT_LT(Lo.MaxComponentValue(), 1.01)
            << description << ": Lo = " << Lo << ", wo = " << wo;
    }
}